

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCompositeCurveSegment::IfcCompositeCurveSegment
          (IfcCompositeCurveSegment *this)

{
  IfcCompositeCurveSegment *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x78,"IfcCompositeCurveSegment");
  IfcGeometricRepresentationItem::IfcGeometricRepresentationItem
            (&this->super_IfcGeometricRepresentationItem,&PTR_construction_vtable_24__00f6b3a0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCompositeCurveSegment,_3UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCompositeCurveSegment,_3UL> *)
             &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20,
             &PTR_construction_vtable_24__00f6b3e8);
  (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf6b310;
  *(undefined8 *)&this->field_0x78 = 0xf6b388;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf6b338;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf6b360;
  std::__cxx11::string::string((string *)&(this->super_IfcGeometricRepresentationItem).field_0x30);
  std::__cxx11::string::string((string *)&this->SameSense);
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>::Lazy(&this->ParentCurve,(LazyObject *)0x0);
  return;
}

Assistant:

IfcCompositeCurveSegment() : Object("IfcCompositeCurveSegment") {}